

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int declaration_specifiers(sym_t *s)

{
  int iVar1;
  sym_t *in_stack_ffffffffffffffe8;
  int local_4;
  
  iVar1 = type_specifier(in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    do {
      iVar1 = declaration_specifiers(in_stack_ffffffffffffffe8);
    } while (iVar1 != 0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int declaration_specifiers(sym_t* s)
{
    if (type_specifier(s))
    {
        while (declaration_specifiers(s))
            ;
        return 1;
    }

    return 0;
}